

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rdopt.c
# Opt level: O2

void av1_rd_pick_intra_mode_sb
               (AV1_COMP *cpi,macroblock *x,RD_STATS *rd_cost,BLOCK_SIZE bsize,
               PICK_MODE_CONTEXT *ctx,int64_t best_rd)

{
  int iVar1;
  MB_MODE_INFO *pMVar2;
  SequenceHeader *pSVar3;
  IntraBCMVCosts *dv_costs;
  BLOCK_SIZE BVar4;
  CANDIDATE_MV CVar5;
  CANDIDATE_MV CVar6;
  CANDIDATE_MV CVar7;
  uint8_t *puVar8;
  uint8_t *puVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  RD_STATS *pRVar12;
  AV1_COMP *pAVar13;
  PICK_MODE_CONTEXT *pPVar14;
  CFL_ALLOWED_TYPE CVar15;
  byte bVar16;
  uint8_t uVar17;
  uint uVar18;
  int iVar19;
  FULLPEL_MV mv;
  int iVar20;
  int64_t iVar21;
  long lVar22;
  buf_2d *pbVar23;
  byte bVar24;
  int iVar25;
  uint uVar26;
  long lVar27;
  ulong uVar28;
  int iVar29;
  int_mv iVar30;
  size_t __n;
  int iVar31;
  int iVar32;
  int iVar33;
  uint8_t uv_skip_txfm;
  int_mv local_bec;
  AV1_COMP *local_be8;
  RD_STATS *local_be0;
  MV dv;
  int_mv best_mv;
  uint8_t y_skip_txfm;
  MACROBLOCKD *xd;
  MB_MODE_INFO *local_bc0;
  PICK_MODE_CONTEXT *local_bb8;
  int_mv nearmv;
  ulong local_ba8;
  long local_ba0;
  ulong local_b98;
  ulong local_b90;
  AV1_COMMON *local_b88;
  int local_b7c;
  int local_b78;
  int local_b74;
  FULLPEL_MV local_b70;
  int local_b6c;
  int local_b68;
  int rate_uv_tokenonly;
  int rate_uv;
  int rate_y;
  int_mv best_hash_mv;
  int_mv nearestmv;
  uint8_t *local_b50;
  long local_b48;
  ulong local_b40;
  ulong local_b38;
  ulong local_b30;
  int **local_b28;
  PALETTE_MODE_INFO *local_b20;
  IntraBCMVCosts *local_b18;
  ulong local_b10;
  ulong local_b08;
  IntraBCHashInfo *local_b00;
  MB_MODE_INFO *local_af8;
  int64_t dist_uv;
  int64_t dist_y;
  int rate_y_tokenonly;
  RD_STATS best_rdstats;
  RD_STATS rd_stats_yuv;
  FULLPEL_MV_STATS best_mv_stats;
  FULLPEL_MOTION_SEARCH_PARAMS local_a78;
  buf_2d yv12_mb [3];
  RD_STATS local_938;
  RD_STATS rd_stats_y;
  MB_MODE_INFO best_mbmi;
  uint8_t best_tx_type_map [1024];
  uint8_t best_blk_skip [1024];
  
  local_af8 = *(x->e_mbd).mi;
  uVar17 = ((cpi->common).seq_params)->monochrome;
  rate_y = 0;
  rate_uv = 0;
  rate_y_tokenonly = 0;
  local_b88 = &cpi->common;
  rate_uv_tokenonly = 0;
  y_skip_txfm = '\0';
  uv_skip_txfm = '\0';
  dist_y = 0;
  dist_uv = 0;
  (ctx->rd_stats).skip_txfm = '\0';
  local_af8->ref_frame[0] = '\0';
  local_af8->ref_frame[1] = -1;
  local_af8->mv[0].as_int = 0;
  xd = &x->e_mbd;
  local_af8->field_0xa7 = local_af8->field_0xa7 & 0x3f;
  local_be0 = rd_cost;
  local_bb8 = ctx;
  iVar21 = av1_rd_pick_intra_sby_mode
                     (cpi,x,&rate_y,&rate_y_tokenonly,&dist_y,&y_skip_txfm,bsize,best_rd,ctx);
  local_be8 = cpi;
  set_mode_eval_params(cpi,x,'\0');
  pRVar12 = local_be0;
  local_ba8 = (ulong)bsize;
  if (iVar21 < best_rd) {
    if (uVar17 == '\0') {
      if ((((x->e_mbd).is_chroma_ref == true) &&
          (((local_be8->common).seq_params)->monochrome == '\0')) &&
         (CVar15 = is_cfl_allowed(xd), pPVar14 = local_bb8, CVar15 != '\0')) {
        memcpy((x->txfm_search_info).blk_skip,local_bb8->blk_skip,(long)local_bb8->num_4x4_blk);
        memcpy((x->e_mbd).tx_type_map,pPVar14->tx_type_map,(long)pPVar14->num_4x4_blk);
      }
      pMVar2 = *(x->e_mbd).mi;
      if ((x->e_mbd).lossless[*(ushort *)&pMVar2->field_0xa7 & 7] == 0) {
        bVar24 = ""[av1_ss_size_lookup[pMVar2->bsize][(x->e_mbd).plane[1].subsampling_x]
                    [(x->e_mbd).plane[1].subsampling_y]];
        bVar16 = 3;
        if ((1 < bVar24 - 0xb) && (bVar16 = 3, bVar24 != 4)) {
          if (bVar24 == 0x11) {
            bVar16 = 9;
          }
          else {
            bVar16 = bVar24;
            if (bVar24 == 0x12) {
              bVar16 = 10;
            }
          }
        }
      }
      else {
        bVar16 = 0;
      }
      av1_rd_pick_intra_sbuv_mode
                (local_be8,x,&rate_uv,&rate_uv_tokenonly,&dist_uv,&uv_skip_txfm,
                 (BLOCK_SIZE)local_ba8,bVar16);
      lVar27 = dist_uv;
      iVar19 = rate_uv;
    }
    else {
      lVar27 = 0;
      iVar19 = 0;
    }
    lVar22 = (long)rate_y;
    uVar18 = av1_get_skip_txfm_context(xd);
    lVar22 = (long)(x->mode_costs).skip_txfm_cost[uVar18][0] + iVar19 + lVar22;
    iVar19 = (int)lVar22;
    pRVar12->rate = iVar19;
    pRVar12->dist = lVar27 + dist_y;
    lVar27 = (lVar27 + dist_y) * 0x80 + (x->rdmult * lVar22 + 0x100 >> 9);
    pRVar12->rdcost = lVar27;
    pRVar12->skip_txfm = '\0';
    if ((iVar19 != 0x7fffffff) && (lVar27 < best_rd)) {
      best_rd = lVar27;
    }
  }
  else {
    local_be0->rate = 0x7fffffff;
  }
  pAVar13 = local_be8;
  if (((((((local_b88->current_frame).frame_type & 0xfd) == 0) &&
        ((local_be8->common).features.allow_screen_content_tools == true)) &&
       ((local_be8->common).features.allow_intrabc != false)) &&
      (((local_be8->oxcf).kf_cfg.enable_intrabc == true && ((local_be8->sf).mv_sf.use_intrabc != 0))
      )) && ((local_be8->sf).rt_sf.use_nonrd_pick_mode == 0)) {
    pSVar3 = (local_be8->common).seq_params;
    uVar17 = pSVar3->monochrome;
    local_bc0 = *(x->e_mbd).mi;
    iVar19 = (x->e_mbd).mi_row;
    local_b68 = (x->e_mbd).mi_col;
    local_b90 = (ulong)block_size_wide[local_ba8];
    bVar24 = (byte)pSVar3->mib_size_log2;
    local_b40 = (ulong)(uint)(iVar19 >> (bVar24 & 0x1f));
    local_be0 = (RD_STATS *)CONCAT44(local_be0._4_4_,local_b68);
    local_b68 = local_b68 >> (bVar24 & 0x1f);
    local_b98 = (ulong)block_size_high[local_ba8];
    local_b48 = best_rd;
    av1_find_mv_refs(local_b88,xd,local_bc0,'\0',(x->mbmi_ext).ref_mv_count,(x->e_mbd).ref_mv_stack,
                     (x->e_mbd).weight,(int_mv (*) [2])0x0,(x->mbmi_ext).global_mvs,
                     (x->mbmi_ext).mode_context);
    (x->mbmi_ext).weight[0] = *(uint16_t (*) [4])(x->e_mbd).weight[0];
    CVar5 = (x->e_mbd).ref_mv_stack[0][1];
    CVar6 = (x->e_mbd).ref_mv_stack[0][2];
    CVar7 = (x->e_mbd).ref_mv_stack[0][3];
    (x->mbmi_ext).ref_mv_stack[0][0] = (x->e_mbd).ref_mv_stack[0][0];
    (x->mbmi_ext).ref_mv_stack[0][1] = CVar5;
    (x->mbmi_ext).ref_mv_stack[0][2] = CVar6;
    (x->mbmi_ext).ref_mv_stack[0][3] = CVar7;
    av1_find_best_ref_mvs_from_stack(0,&x->mbmi_ext,'\0',&nearestmv,&nearmv,0);
    if (nearestmv.as_int == 0x80008000) {
      nearestmv.as_int = 0;
    }
    if (nearmv.as_int == 0x80008000) {
      nearmv.as_int = 0;
    }
    iVar29 = (uint)(uVar17 == '\0') * 2 + 1;
    local_bec = nearmv;
    if (nearestmv.as_int != 0) {
      local_bec = nearestmv;
    }
    if (local_bec.as_int == 0) {
      iVar25 = ((pAVar13->common).seq_params)->mib_size;
      local_bec.as_int = iVar25 * 0xffe0 & 0xffff;
      if (iVar19 - iVar25 < (x->e_mbd).tile.mi_row_start) {
        local_bec.as_int = iVar25 * -0x200000 + 0xf8000000;
      }
    }
    (x->mbmi_ext).ref_mv_stack[0][0].this_mv = local_bec;
    av1_setup_pred_block
              (xd,yv12_mb,(x->e_mbd).cur_buf,(scale_factors *)0x0,(scale_factors *)0x0,iVar29);
    pAVar13 = local_be8;
    pbVar23 = (x->e_mbd).plane[0].pre;
    for (uVar28 = 0; (uint)(iVar29 * 0x20) != uVar28; uVar28 = uVar28 + 0x20) {
      puVar8 = *(uint8_t **)((long)&yv12_mb[0].buf + uVar28);
      puVar9 = *(uint8_t **)((long)&yv12_mb[0].buf0 + uVar28);
      uVar10 = *(undefined8 *)((long)&yv12_mb[0].width + uVar28);
      uVar11 = *(undefined8 *)((long)&yv12_mb[0].stride + uVar28);
      pbVar23->width = (int)uVar10;
      pbVar23->height = (int)((ulong)uVar10 >> 0x20);
      *(undefined8 *)&pbVar23->stride = uVar11;
      pbVar23->buf = puVar8;
      pbVar23->buf0 = puVar9;
      pbVar23 = (buf_2d *)((long)(pbVar23 + 0x51) + 0x10);
    }
    memcpy(&best_mbmi,local_bc0,0xb0);
    best_rdstats.skip_txfm = pRVar12->skip_txfm;
    best_rdstats._33_7_ = *(undefined7 *)&pRVar12->field_0x21;
    best_rdstats.rate = pRVar12->rate;
    best_rdstats.zero_rate = pRVar12->zero_rate;
    best_rdstats.dist = pRVar12->dist;
    best_rdstats.rdcost = pRVar12->rdcost;
    best_rdstats.sse = pRVar12->sse;
    memset(best_blk_skip,0,0x400);
    memcpy(best_tx_type_map,(x->e_mbd).tx_type_map,(long)local_bb8->num_4x4_blk);
    bVar24 = (pAVar13->sf).mv_sf.search_method;
    iVar29 = (pAVar13->sf).mv_sf.use_bsize_dependent_search_method;
    bVar16 = (byte)local_b98;
    if ((byte)local_b90 < (byte)local_b98) {
      bVar16 = (byte)local_b90;
    }
    if ((0x1f < bVar16 && iVar29 == 1) ||
       (((0xf < bVar16 && 1 < iVar29 && ((x->content_state_sb).source_sad_nonrd < kHighSad)) &&
        (x->qindex < 0xc0)))) {
      if (bVar24 < 0xb) {
        bVar24 = (&DAT_00461998)[bVar24];
      }
      else {
        bVar24 = 0;
      }
    }
    local_b70 = get_fullmv_from_mv(&local_bec.as_mv);
    BVar4 = (BLOCK_SIZE)local_ba8;
    av1_make_default_fullpel_ms_params
              (&local_a78,pAVar13,x,BVar4,&local_bec.as_mv,local_b70,
               (pAVar13->mv_search_params).search_site_cfg[1],bVar24,0);
    dv_costs = x->dv_costs;
    av1_set_ms_to_intra_mode(&local_a78,dv_costs);
    local_b6c = (int)local_b40 + 1;
    local_b00 = &x->intrabc_hash_info;
    local_b78 = iVar19 << 5;
    local_b7c = (int)local_be0 << 5;
    local_b08 = (ulong)(uint)((int)local_b98 * 8);
    local_b30 = 0x10003L >> (BVar4 & 0x3f);
    local_b38 = 0x20005L >> (BVar4 & 0x3f);
    local_b10 = (ulong)(uint)((int)local_b90 * 8);
    local_b74 = ((int)local_be0 >> 4) + -4;
    local_b20 = &local_bc0->palette_mode_info;
    local_b28 = dv_costs->dv_costs;
    local_b50 = (x->txfm_search_info).blk_skip;
    local_ba0 = local_b48;
    local_b18 = dv_costs;
    for (uVar18 = 0; uVar18 != 2; uVar18 = uVar18 + 1) {
      local_a78.mv_limits.col_min = ((x->e_mbd).tile.mi_col_start - (int)local_be0) * 4;
      if ((uVar18 & 1) == 0) {
        iVar25 = (x->e_mbd).tile.mi_col_end;
        iVar29 = ((pAVar13->common).seq_params)->mib_size * (int)local_b40;
      }
      else {
        iVar29 = ((pAVar13->common).seq_params)->mib_size;
        iVar25 = iVar29 * local_b68;
        iVar29 = iVar29 * local_b6c;
        iVar32 = (x->e_mbd).tile.mi_row_end;
        if (iVar32 <= iVar29) {
          iVar29 = iVar32;
        }
      }
      local_a78.mv_limits.row_min = ((x->e_mbd).tile.mi_row_start - iVar19) * 4;
      local_a78.mv_limits.col_max = (iVar25 - (int)local_be0) * 4 - (int)local_b90;
      local_a78.mv_limits.row_max = (iVar29 - iVar19) * 4 - (int)local_b98;
      av1_set_mv_search_range(&local_a78.mv_limits,&local_bec.as_mv);
      if ((local_a78.mv_limits.col_min <= local_a78.mv_limits.col_max) &&
         (local_a78.mv_limits.row_min <= local_a78.mv_limits.row_max)) {
        iVar29 = av1_full_pixel_search
                           (local_b70,&local_a78,(pAVar13->mv_search_params).mv_step_param,
                            (int *)0x0,&best_mv.as_fullmv,&best_mv_stats,(FULLPEL_MV *)0x0);
        iVar25 = av1_intrabc_hash_search(pAVar13,xd,&local_a78,local_b00,&best_hash_mv.as_fullmv);
        if (iVar25 < iVar29) {
          best_mv = best_hash_mv;
          uVar26 = best_hash_mv.as_int >> 0x10;
          iVar30 = best_hash_mv;
        }
        else {
          if (iVar29 == 0x7fffffff) goto LAB_001ee4a1;
          iVar30.as_int = best_mv.as_int & 0xffff;
          uVar26 = best_mv.as_int >> 0x10;
        }
        dv = (MV)(iVar30.as_int << 3 & 0xffff | uVar26 << 0x13);
        mv = get_fullmv_from_mv(&dv);
        iVar29 = av1_is_fullmv_in_range(&local_a78.mv_limits,mv);
        if (iVar29 != 0) {
          iVar29 = (short)(iVar30.as_int << 3) + local_b78;
          iVar25 = (x->e_mbd).tile.mi_row_start * 0x20;
          if (iVar25 <= iVar29) {
            iVar32 = (short)(uVar26 << 3) + local_b7c;
            uVar26 = (x->e_mbd).tile.mi_col_start;
            iVar33 = uVar26 * 0x20;
            if ((iVar33 <= iVar32) &&
               (iVar20 = (int)local_b08 + iVar29, iVar20 <= (x->e_mbd).tile.mi_row_end * 0x20)) {
              iVar31 = iVar32 + (int)local_b10;
              iVar1 = (x->e_mbd).tile.mi_col_end;
              if (iVar31 <= iVar1 * 0x20) {
                pSVar3 = (pAVar13->common).seq_params;
                if ((((x->e_mbd).is_chroma_ref != true) || (pSVar3->monochrome != '\0')) ||
                   ((((local_b30 & 1) == 0 ||
                     (((x->e_mbd).plane[1].subsampling_x == 0 || (iVar33 + 0x20 <= iVar32)))) &&
                    (((local_b38 & 1) == 0 ||
                     (((x->e_mbd).plane[1].subsampling_y == 0 || (iVar25 + 0x20 <= iVar29)))))))) {
                  bVar24 = (byte)pSVar3->mib_size_log2;
                  iVar25 = iVar19 >> (bVar24 & 0x1f);
                  iVar32 = 4 << (bVar24 & 0x1f);
                  iVar29 = ((iVar20 >> 3) + -1) / iVar32;
                  if ((iVar29 <= iVar25) &&
                     ((iVar33 = (iVar31 >> 3) + -1 >> 6, iVar20 = ((int)(iVar1 + ~uVar26) >> 4) + 1,
                      iVar29 * iVar20 + iVar33 < iVar25 * iVar20 + local_b74 &&
                      (iVar33 < (int)((iVar25 - iVar29) * ((0x40 < iVar32) + 5) + local_b74))))) {
                    local_b20->palette_colors[0x10] = 0;
                    local_b20->palette_colors[0x11] = 0;
                    local_b20->palette_colors[0x12] = 0;
                    local_b20->palette_colors[0x13] = 0;
                    local_b20->palette_colors[0x14] = 0;
                    local_b20->palette_colors[0x15] = 0;
                    local_b20->palette_colors[0x16] = 0;
                    local_b20->palette_colors[0x17] = 0;
                    local_b20->palette_colors[8] = 0;
                    local_b20->palette_colors[9] = 0;
                    local_b20->palette_colors[10] = 0;
                    local_b20->palette_colors[0xb] = 0;
                    local_b20->palette_colors[0xc] = 0;
                    local_b20->palette_colors[0xd] = 0;
                    local_b20->palette_colors[0xe] = 0;
                    local_b20->palette_colors[0xf] = 0;
                    local_b20->palette_colors[0] = 0;
                    local_b20->palette_colors[1] = 0;
                    local_b20->palette_colors[2] = 0;
                    local_b20->palette_colors[3] = 0;
                    local_b20->palette_colors[4] = 0;
                    local_b20->palette_colors[5] = 0;
                    local_b20->palette_colors[6] = 0;
                    local_b20->palette_colors[7] = 0;
                    local_b20->palette_size[0] = '\0';
                    local_b20->palette_size[1] = '\0';
                    (local_bc0->filter_intra_mode_info).use_filter_intra = '\0';
                    local_bc0->field_0xa7 = local_bc0->field_0xa7 | 0x80;
                    local_bc0->mode = '\0';
                    local_bc0->uv_mode = '\0';
                    local_bc0->motion_mode = '\0';
                    local_bc0->mv[0].as_mv = dv;
                    (local_bc0->interp_filters).as_int = 0x30003;
                    local_bc0->skip_txfm = '\0';
                    BVar4 = (BLOCK_SIZE)local_ba8;
                    av1_enc_build_inter_predictor
                              (local_b88,xd,iVar19,(int)local_be0,(BUFFER_SET *)0x0,BVar4,0,
                               (uint)(((pAVar13->common).seq_params)->monochrome == '\0') * 2);
                    iVar29 = av1_mv_bit_cost(&dv,&local_bec.as_mv,local_b18->joint_mv,local_b28,0x78
                                            );
                    iVar29 = av1_txfm_search(pAVar13,x,BVar4,&rd_stats_yuv,&rd_stats_y,&local_938,
                                             iVar29 + (x->mode_costs).intrabc_cost[1],
                                             0x7fffffffffffffff);
                    if ((iVar29 != 0) &&
                       (lVar27 = rd_stats_yuv.dist * 0x80 +
                                 ((long)x->rdmult * (long)rd_stats_yuv.rate + 0x100 >> 9),
                       rd_stats_yuv.rdcost = lVar27, lVar27 < local_ba0)) {
                      memcpy(&best_mbmi,local_bc0,0xb0);
                      best_rdstats.zero_rate = rd_stats_yuv.zero_rate;
                      best_rdstats.rate = rd_stats_yuv.rate;
                      best_rdstats.dist = rd_stats_yuv.dist;
                      best_rdstats.rdcost = rd_stats_yuv.rdcost;
                      best_rdstats.sse = rd_stats_yuv.sse;
                      best_rdstats.skip_txfm = rd_stats_yuv.skip_txfm;
                      best_rdstats._33_7_ = rd_stats_yuv._33_7_;
                      __n = (ulong)(x->e_mbd).width * (ulong)(x->e_mbd).height;
                      memcpy(best_blk_skip,local_b50,__n);
                      memcpy(best_tx_type_map,(x->e_mbd).tx_type_map,__n);
                      local_ba0 = lVar27;
                    }
                  }
                }
              }
            }
          }
        }
      }
LAB_001ee4a1:
    }
    memcpy(local_bc0,&best_mbmi,0xb0);
    puVar8 = local_b50;
    pRVar12->rate = best_rdstats.rate;
    pRVar12->zero_rate = best_rdstats.zero_rate;
    pRVar12->dist = best_rdstats.dist;
    pRVar12->rdcost = best_rdstats.rdcost;
    pRVar12->sse = best_rdstats.sse;
    pRVar12->skip_txfm = best_rdstats.skip_txfm;
    *(undefined7 *)&pRVar12->field_0x21 = best_rdstats._33_7_;
    memcpy(local_b50,best_blk_skip,(ulong)(x->e_mbd).width * (ulong)(x->e_mbd).height);
    memcpy((x->e_mbd).tx_type_map,best_tx_type_map,(long)local_bb8->num_4x4_blk);
    if (local_ba0 < local_b48) {
      (local_bb8->rd_stats).skip_txfm = local_af8->skip_txfm;
      memcpy(local_bb8->blk_skip,puVar8,(long)local_bb8->num_4x4_blk);
    }
  }
  pPVar14 = local_bb8;
  if (pRVar12->rate != 0x7fffffff) {
    memcpy(local_bb8,*(x->e_mbd).mi,0xb0);
    uVar17 = av1_ref_frame_type((*(x->e_mbd).mi)->ref_frame);
    av1_copy_mbmi_ext_to_mbmi_ext_frame(&pPVar14->mbmi_ext_best,&x->mbmi_ext,uVar17);
    memcpy(pPVar14->tx_type_map,(x->e_mbd).tx_type_map,(long)pPVar14->num_4x4_blk);
  }
  return;
}

Assistant:

void av1_rd_pick_intra_mode_sb(const struct AV1_COMP *cpi, struct macroblock *x,
                               struct RD_STATS *rd_cost, BLOCK_SIZE bsize,
                               PICK_MODE_CONTEXT *ctx, int64_t best_rd) {
  const AV1_COMMON *const cm = &cpi->common;
  MACROBLOCKD *const xd = &x->e_mbd;
  MB_MODE_INFO *const mbmi = xd->mi[0];
  const int num_planes = av1_num_planes(cm);
  TxfmSearchInfo *txfm_info = &x->txfm_search_info;
  int rate_y = 0, rate_uv = 0, rate_y_tokenonly = 0, rate_uv_tokenonly = 0;
  uint8_t y_skip_txfm = 0, uv_skip_txfm = 0;
  int64_t dist_y = 0, dist_uv = 0;

  ctx->rd_stats.skip_txfm = 0;
  mbmi->ref_frame[0] = INTRA_FRAME;
  mbmi->ref_frame[1] = NONE_FRAME;
  mbmi->use_intrabc = 0;
  mbmi->mv[0].as_int = 0;
  mbmi->skip_mode = 0;

  const int64_t intra_yrd =
      av1_rd_pick_intra_sby_mode(cpi, x, &rate_y, &rate_y_tokenonly, &dist_y,
                                 &y_skip_txfm, bsize, best_rd, ctx);

  // Initialize default mode evaluation params
  set_mode_eval_params(cpi, x, DEFAULT_EVAL);

  if (intra_yrd < best_rd) {
    // Search intra modes for uv planes if needed
    if (num_planes > 1) {
      // Set up the tx variables for reproducing the y predictions in case we
      // need it for chroma-from-luma.
      if (xd->is_chroma_ref && store_cfl_required_rdo(cm, x)) {
        memcpy(txfm_info->blk_skip, ctx->blk_skip,
               sizeof(txfm_info->blk_skip[0]) * ctx->num_4x4_blk);
        av1_copy_array(xd->tx_type_map, ctx->tx_type_map, ctx->num_4x4_blk);
      }
      const TX_SIZE max_uv_tx_size = av1_get_tx_size(AOM_PLANE_U, xd);
      av1_rd_pick_intra_sbuv_mode(cpi, x, &rate_uv, &rate_uv_tokenonly,
                                  &dist_uv, &uv_skip_txfm, bsize,
                                  max_uv_tx_size);
    }

    // Intra block is always coded as non-skip
    rd_cost->rate =
        rate_y + rate_uv +
        x->mode_costs.skip_txfm_cost[av1_get_skip_txfm_context(xd)][0];
    rd_cost->dist = dist_y + dist_uv;
    rd_cost->rdcost = RDCOST(x->rdmult, rd_cost->rate, rd_cost->dist);
    rd_cost->skip_txfm = 0;
  } else {
    rd_cost->rate = INT_MAX;
  }

  if (rd_cost->rate != INT_MAX && rd_cost->rdcost < best_rd)
    best_rd = rd_cost->rdcost;
  if (rd_pick_intrabc_mode_sb(cpi, x, ctx, rd_cost, bsize, best_rd) < best_rd) {
    ctx->rd_stats.skip_txfm = mbmi->skip_txfm;
    memcpy(ctx->blk_skip, txfm_info->blk_skip,
           sizeof(txfm_info->blk_skip[0]) * ctx->num_4x4_blk);
    assert(rd_cost->rate != INT_MAX);
  }
  if (rd_cost->rate == INT_MAX) return;

  ctx->mic = *xd->mi[0];
  av1_copy_mbmi_ext_to_mbmi_ext_frame(&ctx->mbmi_ext_best, &x->mbmi_ext,
                                      av1_ref_frame_type(xd->mi[0]->ref_frame));
  av1_copy_array(ctx->tx_type_map, xd->tx_type_map, ctx->num_4x4_blk);
}